

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::navigateToParent(QFileDialogPrivate *this)

{
  ulong uVar1;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QString newDirectory;
  QDir dir;
  QString *in_stack_ffffffffffffff68;
  QString *_t1;
  QString *in_stack_ffffffffffffff98;
  QFileDialog *in_stack_ffffffffffffffa0;
  QString local_48;
  undefined1 *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootDirectory();
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x75c848);
  uVar1 = QDir::isRoot();
  if ((uVar1 & 1) == 0) {
    QDir::cdUp();
    QDir::absolutePath();
    QString::operator=((QString *)in_RDI,in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x75c8d6);
  }
  else {
    QFileSystemModel::myComputer((int)&local_28);
    ::QVariant::toString();
    QString::operator=((QString *)in_RDI,in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x75c898);
    ::QVariant::~QVariant(&local_28);
  }
  _t1 = &local_48;
  QFileDialog::setDirectory(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  QFileDialog::directoryEntered((QFileDialog *)in_RDI,_t1);
  QString::~QString((QString *)0x75c900);
  QDir::~QDir((QDir *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::navigateToParent()
{
    Q_Q(QFileDialog);
    QDir dir(model->rootDirectory());
    QString newDirectory;
    if (dir.isRoot()) {
        newDirectory = model->myComputer().toString();
    } else {
        dir.cdUp();
        newDirectory = dir.absolutePath();
    }
    q->setDirectory(newDirectory);
    emit q->directoryEntered(newDirectory);
}